

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

ComparisonStatusFlags __thiscall
Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringNotContains>::operator()
          (Comparator<Corrade::TestSuite::Compare::StringNotContains> *this,StringView actual,
          StringView expectedToNotContain)

{
  UnderlyingType UVar1;
  long lVar2;
  
  (this->_actualValue)._data = actual._data;
  (this->_actualValue)._sizePlusFlags = actual._sizePlusFlags;
  (this->_expectedToNotContainValue)._data = expectedToNotContain._data;
  (this->_expectedToNotContainValue)._sizePlusFlags = expectedToNotContain._sizePlusFlags;
  lVar2 = Corrade::Containers::Implementation::stringFindString
                    (actual._data,actual._sizePlusFlags & 0x3fffffffffffffff,
                     expectedToNotContain._data,
                     expectedToNotContain._sizePlusFlags & 0x3fffffffffffffff);
  UVar1 = '\x01';
  if (lVar2 == 0) {
    UVar1 = '\b';
  }
  return (ComparisonStatusFlags)UVar1;
}

Assistant:

ComparisonStatusFlags Comparator<Compare::StringNotContains>::operator()(const Containers::StringView actual, const Containers::StringView expectedToNotContain) {
    _actualValue = actual;
    _expectedToNotContainValue = expectedToNotContain;

    /* Unlike the other comparators, here it can't pass if the strings are the
       same, meaning we report the verbose message always */
    if(actual.contains(expectedToNotContain)) return ComparisonStatusFlag::Failed;
    return ComparisonStatusFlag::Verbose;
}